

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O2

TPZGeoEl * TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *Mesh,int64_t ElemIndex,int targetSide)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  _Rb_tree_color _Var5;
  TPZGeoEl **ppTVar6;
  TPZGeoEl *pTVar7;
  ostream *poVar8;
  iterator iVar9;
  int64_t iVar10;
  int64_t iVar11;
  int64_t nelem;
  int64_t nelem_00;
  int64_t nelem_01;
  TPZGeoNode *pTVar12;
  _Base_ptr p_Var13;
  int nd;
  long lVar14;
  TPZAdmChunkVector<TPZGeoNode,_10> *this;
  int targetSide_local;
  _Rb_tree_color local_1ac;
  TPZGeoEl *local_1a8;
  int tsNode;
  undefined4 uStack_19c;
  TPZGeoEl *local_198;
  _Rb_tree_color local_190;
  double local_188;
  REAL local_180;
  _func_int **local_178;
  _Self __tmp;
  TPZGeoElSide targetSideEl;
  set<int,_std::less<int>,_std::allocator<int>_> targetSideNodes_set;
  TPZStack<int,_10> targetSideEdges;
  TPZStack<int,_10> targetSideNodes;
  set<int,_std::less<int>,_std::allocator<int>_> NOTtargetSideEdges_set;
  set<int,_std::less<int>,_std::allocator<int>_> targetSideEdges_set;
  
  targetSide_local = targetSide;
  ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(Mesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,ElemIndex);
  pTVar7 = *ppTVar6;
  cVar2 = (**(code **)(*(long *)pTVar7 + 0xd0))(pTVar7);
  if (cVar2 != '\0') {
    pTVar7 = ChangeToQuadratic(Mesh,ElemIndex);
  }
  uVar3 = (**(code **)(*(long *)pTVar7 + 0xb8))(pTVar7);
  TPZStack<int,_10>::TPZStack(&targetSideNodes);
  TPZStack<int,_10>::TPZStack(&targetSideEdges);
  switch(uVar3) {
  case 0:
    break;
  case 1:
    pztopology::TPZLine::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZLine::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  case 2:
    pztopology::TPZTriangle::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZTriangle::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  case 3:
    pztopology::TPZQuadrilateral::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZQuadrilateral::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  case 4:
    pztopology::TPZTetrahedron::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZTetrahedron::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  case 5:
    pztopology::TPZPyramid::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZPyramid::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  case 6:
    pztopology::TPZPrism::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZPrism::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  case 7:
    pztopology::TPZCube::LowerDimensionSides(targetSide_local,&targetSideNodes,0);
    pztopology::TPZCube::LowerDimensionSides(targetSide_local,&targetSideEdges,1);
    break;
  default:
    poVar8 = std::operator<<((ostream *)&std::cout,"Element type not found on ");
    poVar8 = std::operator<<(poVar8,
                             "static TPZGeoEl *TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *, int64_t, int)"
                            );
    std::endl<char,std::char_traits<char>>(poVar8);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SpecialMaps/tpzchangeel.cpp"
               ,0x149);
  }
  targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_header;
  targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &targetSideEdges_set._M_t._M_impl.super__Rb_tree_header;
  targetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  targetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  targetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header;
  NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178 = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  targetSideEl.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  targetSideEl.fSide = targetSide_local;
  lVar14 = 0;
  local_1a8 = pTVar7;
  targetSideEl.fGeoEl = pTVar7;
  targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       targetSideNodes_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  targetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  targetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; lVar14 < targetSideNodes.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
      lVar14 = lVar14 + 1) {
    tsNode = targetSideNodes.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar14];
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &targetSideNodes_set,&tsNode);
  }
  iVar4 = TPZGeoElSide::Dimension(&targetSideEl);
  if (iVar4 == 0) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &targetSideNodes_set,&targetSide_local);
  }
  for (lVar14 = 0; lVar14 < targetSideEdges.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements
      ; lVar14 = lVar14 + 1) {
    tsNode = targetSideEdges.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[lVar14];
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &targetSideEdges_set,&tsNode);
  }
  iVar4 = TPZGeoElSide::Dimension(&targetSideEl);
  if (iVar4 == 1) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &targetSideEdges_set,&targetSide_local);
  }
  _Var5 = (**(code **)(*(long *)local_1a8 + 0x98))();
  while (local_1ac = _Var5, iVar4 = (**(code **)(*(long *)local_1a8 + 0xf0))(), (int)_Var5 < iVar4)
  {
    _tsNode = local_178;
    local_198 = local_1a8;
    local_190 = local_1ac;
    iVar4 = TPZGeoElSide::Dimension((TPZGeoElSide *)&tsNode);
    if ((iVar4 == 1) &&
       (iVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find(&targetSideEdges_set._M_t,(key_type *)&local_1ac),
       (_Rb_tree_header *)iVar9._M_node == p_Var1)) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &NOTtargetSideEdges_set,(int *)&local_1ac);
    }
    else {
      iVar4 = TPZGeoElSide::Dimension((TPZGeoElSide *)&tsNode);
      if (1 < iVar4) break;
    }
    _Var5 = local_1ac + _S_black;
  }
  this = &Mesh->fNodeVec;
  p_Var13 = NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pTVar7 = local_1a8;
  while ((_Rb_tree_header *)p_Var13 != &NOTtargetSideEdges_set._M_t._M_impl.super__Rb_tree_header) {
    _Var5 = p_Var13[1]._M_color;
    _tsNode = local_178;
    local_198 = pTVar7;
    local_190 = _Var5;
    __tmp._M_node = p_Var13;
    iVar10 = TPZGeoElSide::SideNodeLocIndex((TPZGeoElSide *)&tsNode,0);
    iVar11 = TPZGeoElSide::SideNodeLocIndex((TPZGeoElSide *)&tsNode,1);
    nelem = TPZGeoElSide::SideNodeIndex((TPZGeoElSide *)&tsNode,0);
    nelem_00 = TPZGeoElSide::SideNodeIndex((TPZGeoElSide *)&tsNode,1);
    nelem_01 = (**(code **)(*(long *)local_1a8 + 0xa8))(local_1a8,_Var5);
    local_1ac = (_Rb_tree_color)iVar10;
    iVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&targetSideNodes_set._M_t,(key_type *)&local_1ac);
    pTVar7 = local_1a8;
    if ((_Rb_tree_header *)iVar9._M_node == &targetSideNodes_set._M_t._M_impl.super__Rb_tree_header)
    {
      local_1ac = (_Rb_tree_color)iVar11;
      iVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&targetSideNodes_set._M_t,(key_type *)&local_1ac);
      if ((_Rb_tree_header *)iVar9._M_node !=
          &targetSideNodes_set._M_t._M_impl.super__Rb_tree_header) {
        for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
          pTVar12 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                              (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_00);
          local_180 = TPZGeoNode::Coord(pTVar12,iVar4);
          pTVar12 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                              (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem);
          local_188 = TPZGeoNode::Coord(pTVar12,iVar4);
          pTVar12 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                              (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_01);
          TPZGeoNode::SetCoord(pTVar12,iVar4,local_180 * 0.75 + local_188 * 0.25);
        }
      }
    }
    else {
      for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
        pTVar12 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                            (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem);
        local_180 = TPZGeoNode::Coord(pTVar12,iVar4);
        pTVar12 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                            (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_00);
        local_188 = TPZGeoNode::Coord(pTVar12,iVar4);
        pTVar12 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                            (&this->super_TPZChunkVector<TPZGeoNode,_10>,nelem_01);
        TPZGeoNode::SetCoord(pTVar12,iVar4,local_180 * 0.75 + local_188 * 0.25);
      }
    }
    p_Var13 = (_Base_ptr)std::_Rb_tree_increment(__tmp._M_node);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&NOTtargetSideEdges_set._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&targetSideEdges_set._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&targetSideNodes_set._M_t);
  TPZManVector<int,_10>::~TPZManVector(&targetSideEdges.super_TPZManVector<int,_10>);
  TPZManVector<int,_10>::~TPZManVector(&targetSideNodes.super_TPZManVector<int,_10>);
  return pTVar7;
}

Assistant:

TPZGeoEl* TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *Mesh, int64_t ElemIndex, int targetSide)
{
    TPZGeoEl * gel = Mesh->ElementVec()[ElemIndex];
    
    #ifdef PZDEBUG
    if(!gel)
    {
        std::cout << "Null geoel on " << __PRETTY_FUNCTION__ << std::endl;
        DebugStop();
    }
    #endif
    
    if(gel->IsLinearMapping())
    {
        gel = TPZChangeEl::ChangeToQuadratic(Mesh, ElemIndex);
    }
    
    MElementType gelType = gel->Type();
    
    TPZStack<int> targetSideNodes, targetSideEdges;
    
    switch(gelType)
    {
        case (EPoint):
        {
            TPZPoint::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPoint::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EOned):
        {
            TPZLine::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZLine::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ETriangle):
        {
            TPZTriangle::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZTriangle::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EQuadrilateral):
        {
            TPZQuadrilateral::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZQuadrilateral::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ETetraedro):
        {
            TPZTetrahedron::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZTetrahedron::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EPiramide):
        {
            TPZPyramid::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPyramid::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EPrisma):
        {
            TPZPrism::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPrism::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ECube):
        {
            TPZCube::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZCube::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
        default:
        {
            std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
            DebugStop();
        }
    }
    
    std::set<int> targetSideNodes_set, targetSideEdges_set, NOTtargetSideEdges_set;
    TPZGeoElSide targetSideEl(gel,targetSide);
    for(int nd = 0; nd < targetSideNodes.NElements(); nd++)
    {
        int tsNode = targetSideNodes[nd];
        targetSideNodes_set.insert(tsNode);
    }
    if(targetSideEl.Dimension() == 0)
    {
        targetSideNodes_set.insert(targetSide);
    }
    for(int ed = 0; ed < targetSideEdges.NElements(); ed++)
    {
        int tsEdge = targetSideEdges[ed];
        targetSideEdges_set.insert(tsEdge);
    }
    if(targetSideEl.Dimension() == 1)
    {
        targetSideEdges_set.insert(targetSide);
    }
    for(int sd = gel->NCornerNodes(); sd < gel->NSides(); sd++)
    {
        TPZGeoElSide gelSide(gel,sd);
        if(gelSide.Dimension() == 1 && targetSideEdges_set.find(sd) == targetSideEdges_set.end())
        {
            NOTtargetSideEdges_set.insert(sd);
        }
        else if(gelSide.Dimension() > 1)
        {
            break;
        }
    }
    
    const REAL dist = 0.25;
    
    std::set<int>::iterator it;
    for(it = NOTtargetSideEdges_set.begin(); it != NOTtargetSideEdges_set.end(); it++)
    {
        int edg = *it;
        TPZGeoElSide gelSide(gel,edg);
        
        int64_t initNode = gelSide.SideNodeLocIndex(0);
        int64_t finalNode = gelSide.SideNodeLocIndex(1); 
        int64_t meshInitNode = gelSide.SideNodeIndex(0);
        int64_t meshFinalNode = gelSide.SideNodeIndex(1);
        /**
         * Embora o elemento quadratico possua mais nohs (NNodes), a topologia segue igual ao
         * elemento linear no qual o elemento quadratico foi baseado.
         *
         * Isso quer dizer que Linear(Geom::NNodes) < Quadratic(Geom::NNodes), mas Linear(Geom::NSides) = Quadratic(Geom::NSides)
         *
         * Com isso a numeracao dos nohs nos meios das arestas coincide com a numeracao dos lados unidimensionais do elemento.
         */
        int64_t meshMiddleNode = gel->NodeIndex(edg);
        //********************
                                            
        double coordNear, coordFar;
        
        if(targetSideNodes_set.find(initNode) != targetSideNodes_set.end())//drag middle node to node 0 of this edge
        {
            for(int c = 0; c < 3; c++)
            {
                coordNear = Mesh->NodeVec()[meshInitNode].Coord(c);
                coordFar = Mesh->NodeVec()[meshFinalNode].Coord(c);
                Mesh->NodeVec()[meshMiddleNode].SetCoord(c, (1. - dist)*coordNear + (dist)*coordFar);
            }
        }
        else if(targetSideNodes_set.find(finalNode) != targetSideNodes_set.end())//drag middle node to node 1 of this edge
        {
            for(int c = 0; c < 3; c++)
            {
                coordNear = Mesh->NodeVec()[meshFinalNode].Coord(c);
                coordFar = Mesh->NodeVec()[meshInitNode].Coord(c);
                Mesh->NodeVec()[meshMiddleNode].SetCoord(c, (1. - dist)*coordNear + (dist)*coordFar);
            }
        }
    }				
    
    return gel;
}